

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMTLIB2.cpp
# Opt level: O2

void __thiscall Parse::SMTLIB2::colorSymbol(SMTLIB2 *this,string *name,Color color)

{
  Entry *pEVar1;
  Symbol *this_00;
  UserErrorException *this_01;
  SMTLIB2 *this_02;
  undefined1 local_110 [32];
  undefined1 local_f0 [128];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Lib::
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_Parse::SMTLIB2::SymbolType>,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::find((DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_Parse::SMTLIB2::SymbolType>,_Lib::DefaultHash,_Lib::DefaultHash2>
          *)local_110,
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &this->_declaredSymbols);
  if ((pointer)local_110._0_8_ != (pointer)0x0) {
    std::__cxx11::string::string((string *)local_f0,(string *)name);
    pEVar1 = Lib::
             DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_Parse::SMTLIB2::SymbolType>,_Lib::DefaultHash,_Lib::DefaultHash2>
             ::findEntry(&this->_declaredSymbols,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f0);
    this_02 = (SMTLIB2 *)local_f0;
    std::__cxx11::string::~string((string *)this_02);
    DAT_00a141e0 = 1;
    this_00 = getSymbol(this_02,&pEVar1->_val);
    Kernel::Signature::Symbol::addColor(this_00,color);
    return;
  }
  this_01 = (UserErrorException *)__cxa_allocate_exception(0x50);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_f0 + 0x40),"\'",name);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_f0 + 0x60),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_f0 + 0x40),"\' is not a user symbol");
  std::operator+(&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_f0 + 0x60)," in top-level expression \'");
  Shell::LispParser::Expression::toString_abi_cxx11_
            ((string *)(local_f0 + 0x20),this->_topLevelExpr,true);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                 &local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_f0 + 0x20));
  std::operator+(&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,"\'"
                );
  Lib::UserErrorException::Exception(this_01,&local_50);
  __cxa_throw(this_01,&Lib::UserErrorException::typeinfo,
              Lib::UserErrorException::~UserErrorException);
}

Assistant:

void SMTLIB2::colorSymbol(const std::string& name, Color color)
{
  if (!_declaredSymbols.find(name)) {
    USER_ERROR_EXPR("'"+name+"' is not a user symbol");
  }
  DeclaredSymbol& s = _declaredSymbols.get(name);

  env.colorUsed = true;

  Signature::Symbol* sym = getSymbol(s);
  sym->addColor(color);
}